

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

Stats * __thiscall LockedPool::stats(Stats *__return_storage_ptr__,LockedPool *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  long in_FS_OFFSET;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  Stats i;
  Stats local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    sVar4 = 0;
    sVar5 = 0;
    __return_storage_ptr__->chunks_used = 0;
    __return_storage_ptr__->chunks_free = 0;
    __return_storage_ptr__->total = 0;
    __return_storage_ptr__->locked = 0;
    __return_storage_ptr__->used = 0;
    __return_storage_ptr__->free = 0;
    __return_storage_ptr__->locked = this->cumulative_bytes_locked;
    p_Var2 = (this->arenas).
             super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    sVar3 = 0;
    if (p_Var2 != (_List_node_base *)&this->arenas) {
      sVar6 = 0;
      sVar7 = 0;
      do {
        Arena::stats(&local_60,(Arena *)(p_Var2 + 1));
        sVar3 = sVar3 + local_60.used;
        sVar4 = sVar4 + local_60.free;
        sVar5 = sVar5 + local_60.total;
        __return_storage_ptr__->free = sVar4;
        __return_storage_ptr__->total = sVar5;
        sVar6 = sVar6 + local_60.chunks_used;
        sVar7 = sVar7 + local_60.chunks_free;
        __return_storage_ptr__->chunks_used = sVar6;
        __return_storage_ptr__->chunks_free = sVar7;
        p_Var2 = p_Var2->_M_next;
      } while (p_Var2 != (_List_node_base *)&this->arenas);
    }
    __return_storage_ptr__->used = sVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_system_error(iVar1);
  }
  __stack_chk_fail();
}

Assistant:

LockedPool::Stats LockedPool::stats() const
{
    std::lock_guard<std::mutex> lock(mutex);
    LockedPool::Stats r{0, 0, 0, cumulative_bytes_locked, 0, 0};
    for (const auto &arena: arenas) {
        Arena::Stats i = arena.stats();
        r.used += i.used;
        r.free += i.free;
        r.total += i.total;
        r.chunks_used += i.chunks_used;
        r.chunks_free += i.chunks_free;
    }
    return r;
}